

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modalgamepad.cpp
# Opt level: O2

void handleNubClick(NubClickMode mode,int value,Mouse *mouse,UinputDevice *gamepad,
                   Settings *settings)

{
  ulong __n;
  void *__buf;
  int __flags;
  
  __flags = (int)settings;
  if (3 < mode - NUB_CLICK_LEFT) {
    return;
  }
  __n = (ulong)(uint)value;
  switch(mode) {
  case NUB_CLICK_LEFT:
    __buf = (void *)0x13d;
    break;
  case NUB_CLICK_RIGHT:
    __buf = (void *)0x13e;
    break;
  case MOUSE_LEFT:
    std::mutex::lock(&mouse->mutex);
    UinputDevice::send(&mouse->device,1,(void *)0x110,__n,__flags);
    UinputDevice::send(&mouse->device,0,(void *)0x0,0,__flags);
    goto LAB_001294a3;
  case MOUSE_RIGHT:
    std::mutex::lock(&mouse->mutex);
    UinputDevice::send(&mouse->device,1,(void *)0x111,__n,__flags);
    UinputDevice::send(&mouse->device,0,(void *)0x0,0,__flags);
LAB_001294a3:
    pthread_mutex_unlock((pthread_mutex_t *)&mouse->mutex);
    return;
  }
  UinputDevice::send(gamepad,1,__buf,__n,__flags);
  UinputDevice::send(gamepad,0,(void *)0x0,0,__flags);
  return;
}

Assistant:

void handleNubClick(Settings::NubClickMode mode, int value, Mouse* mouse, UinputDevice* gamepad, Settings const& settings)
{
  switch(mode)
  {
    case Settings::MOUSE_LEFT:
      {
        std::lock_guard<std::mutex> lk(mouse->mutex);
        mouse->device.send(EV_KEY, BTN_LEFT, value);
        mouse->device.send(EV_SYN, 0, 0);
        break;
      }
    case Settings::MOUSE_RIGHT:
      {
        std::lock_guard<std::mutex> lk(mouse->mutex);
        mouse->device.send(EV_KEY, BTN_RIGHT, value);
        mouse->device.send(EV_SYN, 0, 0);
        break;
      }
    case Settings::NUB_CLICK_LEFT:
      gamepad->send(EV_KEY, BTN_THUMBL, value);
      gamepad->send(EV_SYN, 0, 0);
      break;
    case Settings::NUB_CLICK_RIGHT:
      gamepad->send(EV_KEY, BTN_THUMBR, value);
      gamepad->send(EV_SYN, 0, 0);
      break;
  case Settings::UNKNOWN_NUB_CLICK_MODE:
      break;
  }
}